

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O2

bool __thiscall
absl::lts_20240722::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount
          (RefcountAndFlags *this)

{
  uint uVar1;
  
  LOCK();
  uVar1 = (this->count_).super___atomic_base<int>._M_i;
  (this->count_).super___atomic_base<int>._M_i = (this->count_).super___atomic_base<int>._M_i + -2;
  UNLOCK();
  if ((uVar1 & 1) != 0 || 0 < (int)uVar1) {
    return uVar1 != 2;
  }
  __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0xaa,"bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
}

Assistant:

inline bool DecrementExpectHighRefcount() {
    int32_t refcount =
        count_.fetch_sub(kRefIncrement, std::memory_order_acq_rel);
    assert(refcount > 0 || refcount & kImmortalFlag);
    return refcount != kRefIncrement;
  }